

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

ostream * operator<<(ostream *stream,Fad<double> *x)

{
  _Setw _Var1;
  int iVar2;
  ostream *poVar3;
  void *pvVar4;
  double *pdVar5;
  Fad<double> *in_RSI;
  ostream *in_RDI;
  int i;
  int VAL_WIDTH;
  int local_1c;
  
  _Var1 = std::setw(8);
  poVar3 = std::operator<<(in_RDI,_Var1);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::right);
  pdVar5 = Fad<double>::val(in_RSI);
  poVar3 = (ostream *)std::ostream::operator<<(pvVar4,*pdVar5);
  std::operator<<(poVar3," dx: ");
  local_1c = 0;
  while( true ) {
    iVar2 = Vector<double>::size((Vector<double> *)0x1133ba5);
    if (iVar2 <= local_1c) break;
    _Var1 = std::setw(8);
    poVar3 = std::operator<<(in_RDI,_Var1);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::right);
    pdVar5 = Vector<double>::operator[](&in_RSI->dx_,local_1c);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,*pdVar5);
    std::operator<<(poVar3," ");
    local_1c = local_1c + 1;
  }
  return in_RDI;
}

Assistant:

std::ostream& operator<< (std::ostream& stream, const Fad<T>& x)
  {
      const int VAL_WIDTH = 8;
      stream << std::setw(VAL_WIDTH)<<std::right<<x.val()<<" dx: ";
      for (int i=0; i<x.dx_.size(); i++) {
          stream << std::setw(VAL_WIDTH)<<std::right<< x.dx_[i] << " ";
      }
      return stream;
  }